

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bitileave.cpp
# Opt level: O3

void __thiscall
bitmanip::anon_unknown_0::Test_bitileave_ileave_manual_::~Test_bitileave_ileave_manual_
          (Test_bitileave_ileave_manual_ *this)

{
  Test::~Test(&this->super_Test);
  operator_delete(this,0x18);
  return;
}

Assistant:

BITMANIP_TEST(bitileave, ileave_manual)
{
    BITMANIP_STATIC_ASSERT_EQ(ileave(0b1111'1111u, 0u), 0b1010'1010'1010'1010u);
    BITMANIP_STATIC_ASSERT_EQ(ileave(0u, 0b1'1111'1111u), 0b01'0101'0101'0101'0101u);
    BITMANIP_STATIC_ASSERT_EQ(ileave(0u, 0xffff'ffffu), 0x5555'5555'5555'5555u);
    BITMANIP_STATIC_ASSERT_EQ(ileave(0u, static_cast<std::uint32_t>(ileave(0u, 0b11u))), 0b10001u);

    BITMANIP_STATIC_ASSERT_EQ(ileave(0u, 0u, 0b1111u), 0b001001001001u);
    BITMANIP_STATIC_ASSERT_EQ(ileave(0b1111u, 0u, 0u), 0b100100100100u);
}